

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O1

hrgls_Status hrgls_MessageCopy(hrgls_Message *returnMessage,hrgls_Message MessageToCopy)

{
  __suseconds_t _Var1;
  hrgls_Message phVar2;
  hrgls_Status hVar3;
  
  if (MessageToCopy == (hrgls_Message)0x0) {
    hVar3 = 0x3e9;
  }
  else {
    phVar2 = (hrgls_Message)operator_new(0x38);
    (phVar2->value)._M_dataplus._M_p = (pointer)&(phVar2->value).field_2;
    (phVar2->value)._M_string_length = 0;
    (phVar2->value).field_2._M_local_buf[0] = '\0';
    hVar3 = 0;
    std::__cxx11::string::_M_assign((string *)phVar2);
    phVar2->level = MessageToCopy->level;
    _Var1 = (MessageToCopy->timeStamp).tv_usec;
    (phVar2->timeStamp).tv_sec = (MessageToCopy->timeStamp).tv_sec;
    (phVar2->timeStamp).tv_usec = _Var1;
    *returnMessage = phVar2;
  }
  return hVar3;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_MessageCopy(hrgls_Message *returnMessage, hrgls_Message MessageToCopy)
  {
          if (!MessageToCopy) {
            return hrgls_STATUS_BAD_PARAMETER;
          }

	  hrgls_Status s = hrgls_STATUS_OKAY;
	  hrgls_Message ret;
	  try {
		  ret = new hrgls_Message_;
	  } catch (...) {
		  s = hrgls_STATUS_OUT_OF_MEMORY;
		  ret = nullptr;
	  }

	  *ret = *MessageToCopy;

	  *returnMessage = ret;
	  return s;
  }